

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O3

int __thiscall
cmCTestBuildAndTestHandler::RunCMake
          (cmCTestBuildAndTestHandler *this,string *outstring,ostringstream *out,
          string *cmakeOutString,cmake *cm)

{
  char *__s;
  value_type *pvVar1;
  cmCTest *pcVar2;
  int iVar3;
  string *psVar4;
  string *psVar5;
  size_t sVar6;
  long *plVar7;
  long lVar8;
  ostream *poVar9;
  size_type *psVar10;
  string *opt;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostringstream cmCTestLog_msg;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  string *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  cmake *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0 = outstring;
  local_1b0 = cm;
  psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1c8,psVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1c8,&this->SourceDir);
  psVar4 = &this->BuildGenerator;
  if ((this->BuildGenerator)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "-G",psVar4);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  if ((this->BuildGeneratorPlatform)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "-A",&this->BuildGeneratorPlatform);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  if ((this->BuildGeneratorToolset)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "-T",&this->BuildGeneratorToolset);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  psVar5 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  if (psVar5->_M_string_length != 0) {
    psVar5 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
    __s = (psVar5->_M_dataplus)._M_p;
    if (__s != (char *)0x0) {
      local_1f0 = local_1e0;
      sVar6 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,__s,__s + sVar6);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,0x7486f5);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar10) {
        local_1a8._16_8_ = *psVar10;
        local_1a8._24_8_ = plVar7[3];
        local_1a8._0_8_ = local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *psVar10;
        local_1a8._0_8_ = (size_type *)*plVar7;
      }
      local_1a8._8_8_ = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
    }
  }
  if ((this->BuildMakeProgram)._M_string_length != 0) {
    lVar8 = std::__cxx11::string::find((char *)psVar4,0x752efe,0);
    if (lVar8 == -1) {
      lVar8 = std::__cxx11::string::find((char *)psVar4,0x73e368,0);
      if (lVar8 == -1) goto LAB_001995e7;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "-DCMAKE_MAKE_PROGRAM:FILEPATH=",&this->BuildMakeProgram);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
LAB_001995e7:
  __x = (this->BuildOptions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->BuildOptions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pvVar1) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_1c8,__x);
      __x = __x + 1;
    } while (__x != pvVar1);
  }
  iVar3 = cmake::Run(local_1b0,&local_1c8,false);
  if (iVar3 == 0) {
    if (this->BuildTwoConfig == true) {
      iVar3 = cmake::Run(local_1b0,&local_1c8,false);
      if (iVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)out,"Error: cmake execution failed\n",0x1e);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)out,(cmakeOutString->_M_dataplus)._M_p,
                            cmakeOutString->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        if (local_1d0 == (string *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__cxx11::stringbuf::str();
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          if (local_1f0 != local_1e0) {
            operator_delete(local_1f0,local_1e0[0] + 1);
          }
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                       ,0x6f,(char *)local_1f0,false);
          goto LAB_00199818;
        }
        std::__cxx11::stringbuf::str();
        goto LAB_00199682;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,"======== CMake output     ======\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,(cmakeOutString->_M_dataplus)._M_p,cmakeOutString->_M_string_length);
    iVar3 = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,"======== End CMake output ======\n",0x21);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)out,"Error: cmake execution failed\n",0x1e);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)out,(cmakeOutString->_M_dataplus)._M_p,
                        cmakeOutString->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
    if (local_1d0 == (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__cxx11::stringbuf::str();
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                   ,99,(char *)local_1f0,false);
LAB_00199818:
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      std::__cxx11::stringbuf::str();
LAB_00199682:
      std::__cxx11::string::operator=((string *)local_1d0,(string *)local_1a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    iVar3 = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  return iVar3;
}

Assistant:

int cmCTestBuildAndTestHandler::RunCMake(std::string* outstring,
                                         std::ostringstream& out,
                                         std::string& cmakeOutString,
                                         cmake* cm)
{
  std::vector<std::string> args;
  args.push_back(cmSystemTools::GetCMakeCommand());
  args.push_back(this->SourceDir);
  if (!this->BuildGenerator.empty()) {
    args.push_back("-G" + this->BuildGenerator);
  }
  if (!this->BuildGeneratorPlatform.empty()) {
    args.push_back("-A" + this->BuildGeneratorPlatform);
  }
  if (!this->BuildGeneratorToolset.empty()) {
    args.push_back("-T" + this->BuildGeneratorToolset);
  }

  const char* config = nullptr;
  if (!this->CTest->GetConfigType().empty()) {
    config = this->CTest->GetConfigType().c_str();
  }
#ifdef CMAKE_INTDIR
  if (!config) {
    config = CMAKE_INTDIR;
  }
#endif

  if (config) {
    args.push_back("-DCMAKE_BUILD_TYPE:STRING=" + std::string(config));
  }
  if (!this->BuildMakeProgram.empty() &&
      (this->BuildGenerator.find("Make") != std::string::npos ||
       this->BuildGenerator.find("Ninja") != std::string::npos)) {
    args.push_back("-DCMAKE_MAKE_PROGRAM:FILEPATH=" + this->BuildMakeProgram);
  }

  for (std::string const& opt : this->BuildOptions) {
    args.push_back(opt);
  }
  if (cm->Run(args) != 0) {
    out << "Error: cmake execution failed\n";
    out << cmakeOutString << "\n";
    if (outstring) {
      *outstring = out.str();
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE, out.str() << std::endl);
    }
    return 1;
  }
  // do another config?
  if (this->BuildTwoConfig) {
    if (cm->Run(args) != 0) {
      out << "Error: cmake execution failed\n";
      out << cmakeOutString << "\n";
      if (outstring) {
        *outstring = out.str();
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE, out.str() << std::endl);
      }
      return 1;
    }
  }
  out << "======== CMake output     ======\n";
  out << cmakeOutString;
  out << "======== End CMake output ======\n";
  return 0;
}